

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O0

deBool qpXmlWriter_endDocument(qpXmlWriter *writer)

{
  qpXmlWriter *writer_local;
  
  closePending(writer);
  writer->xmlIsWriting = 0;
  return 1;
}

Assistant:

deBool qpXmlWriter_endDocument (qpXmlWriter* writer)
{
	DE_ASSERT(writer);
	DE_ASSERT(writer->xmlIsWriting);
	DE_ASSERT(writer->xmlElementDepth == 0);
	closePending(writer);
	writer->xmlIsWriting = DE_FALSE;
	return DE_TRUE;
}